

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<unsigned_int>(uint length,uint value)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint i;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *puVar6;
  shared_ptr<unsigned_int> pa;
  shared_ptr<unsigned_int> pb;
  
  uVar1 = (ulong)length;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar4 = (long)(int)(length + 1) * 4;
  }
  pvVar3 = operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pvVar3,
             nosimd::common::free<unsigned_int>);
  pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_int>);
  _Var2._M_pi = pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined4 *)((long)pvVar3 + uVar1 * 4) = 0x7f;
  *(undefined4 *)
   ((long)&(pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1 * 4) = 0x3f;
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(uint *)((long)pvVar3 + uVar4 * 4) = value;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(uint *)((long)pvVar3 + lVar5 * 4) != value) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar6 + 1) = 0x16;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(undefined4 *)
       ((long)&(pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _vptr__Sp_counted_base + uVar4 * 4) = *(undefined4 *)((long)pvVar3 + uVar4 * 4);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(uint *)((long)&(pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar5 * 4) != value) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar6 + 1) = 0x1d;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (0 < (int)length) {
    memset(pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
           uVar1 * 4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(int *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + lVar5 * 4) != 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar6 + 1) = 0x24;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
    uVar4 = 0;
    do {
      *(int *)((long)pvVar3 + uVar4 * 4) = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(undefined4 *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar4 * 4) =
           *(undefined4 *)((long)pvVar3 + uVar4 * 4);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if ((int)lVar5 != *(int *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + lVar5 * 4)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned int]";
        *(undefined4 *)(puVar6 + 1) = 0x2d;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if ((*(int *)((long)pvVar3 + uVar1 * 4) == 0x7f) &&
     (*(int *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar1 * 4) == 0x3f)) {
    if (pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar6 = "void test_common(unsigned int, T) [T = unsigned int]";
  *(undefined4 *)(puVar6 + 1) = 0x31;
  *(uint *)((long)puVar6 + 0xc) = length;
  __cxa_throw(puVar6,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}